

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# znzlib.c
# Opt level: O1

int znzrewind(znzFile stream)

{
  int iVar1;
  
  iVar1 = 0;
  if (stream != (znzFile)0x0) {
    if (stream->zfptr == (gzFile)0x0) {
      rewind((FILE *)stream->nzfptr);
      iVar1 = 0;
    }
    else {
      iVar1 = gzseek(stream->zfptr,0,0);
    }
  }
  return iVar1;
}

Assistant:

int znzrewind(znzFile stream)
{
  if (stream==NULL) { return 0; }
#ifdef HAVE_ZLIB
  /* On some systems, gzrewind() fails for uncompressed files.
     Use gzseek(), instead.               10, May 2005 [rickr]

     if (stream->zfptr!=NULL) return gzrewind(stream->zfptr);
  */

  if (stream->zfptr!=NULL) return (int)gzseek(stream->zfptr, 0L, SEEK_SET);
#endif
  rewind(stream->nzfptr);
  return 0;
}